

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  ulong uVar2;
  string *in_RDI;
  char *colon;
  char *gtest_output_flag;
  allocator local_33;
  byte local_32;
  allocator local_31;
  char *local_30;
  allocator local_11;
  char *local_10;
  
  local_10 = (char *)std::__cxx11::string::c_str();
  if (local_10 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    local_30 = strchr(local_10,0x3a);
    pcVar1 = local_10;
    local_32 = 0;
    if (local_30 == (char *)0x0) {
      std::allocator<char>::allocator();
      local_32 = 1;
      std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_31);
    }
    else {
      uVar2 = (long)local_30 - (long)local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,&local_33);
      std::allocator<char>::~allocator((allocator<char> *)&local_33);
    }
    if ((local_32 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL) return std::string("");

  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      std::string(gtest_output_flag) :
      std::string(gtest_output_flag, colon - gtest_output_flag);
}